

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray *
performBitwiseOperationInCopy<std::bit_or<unsigned_char>>(QBitArray *self,QBitArray *other)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (self->d).d.d;
  local_38.ptr = (self->d).d.ptr;
  (self->d).d.d = (Data *)0x0;
  (self->d).d.ptr = (char *)0x0;
  local_38.size = (self->d).d.size;
  (self->d).d.size = 0;
  sizedForOverwrite((QBitArray *)&local_58,(QBitArray *)&local_38,other);
  pDVar2 = (self->d).d.d;
  pcVar3 = (self->d).d.ptr;
  (self->d).d.d = local_58.d;
  (self->d).d.ptr = local_58.ptr;
  qVar1 = (self->d).d.size;
  (self->d).d.size = local_58.size;
  local_58.d = pDVar2;
  local_58.ptr = pcVar3;
  local_58.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  performBitwiseOperationHelper<std::bit_or<unsigned_char>>(self,&local_38,other);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return self;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInCopy(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    QBitArray tmp(std::move(self));
    self = sizedForOverwrite(tmp, other);
    return performBitwiseOperationHelper(self, tmp, other, op);
}